

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::RemoveAt(SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,int i,int last,uint targetBucket)

{
  int iVar1;
  ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> **ppVVar2;
  int **ppiVar3;
  RecyclerWeakReferenceRegionItem<Js::PropertyString_*> **ppRVar4;
  int local_3c;
  uint targetBucket_local;
  int last_local;
  int i_local;
  SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *this_local;
  
  if (last < 0) {
    ppVVar2 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                        ((WriteBarrierPtr *)&this->entries);
    iVar1 = (*ppVVar2)[i].super_ValueEntryData<int>.next;
    ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
    (*ppiVar3)[targetBucket] = iVar1;
  }
  else {
    ppVVar2 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                        ((WriteBarrierPtr *)&this->entries);
    iVar1 = (*ppVVar2)[i].super_ValueEntryData<int>.next;
    ppVVar2 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                        ((WriteBarrierPtr *)&this->entries);
    (*ppVVar2)[last].super_ValueEntryData<int>.next = iVar1;
  }
  ppVVar2 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                      ((WriteBarrierPtr *)&this->entries);
  anon_unknown_4::ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>::Clear
            (*ppVVar2 + i);
  ppRVar4 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReferenceRegionItem__
                      ((WriteBarrierPtr *)&this->weakRefs);
  Memory::RecyclerWeakReferenceRegionItem<Js::PropertyString_*>::Clear(*ppRVar4 + i);
  ppVVar2 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                      ((WriteBarrierPtr *)&this->entries);
  if (this->freeCount == 0) {
    local_3c = -1;
  }
  else {
    local_3c = this->freeList;
  }
  SetNextFreeEntryIndex(this,*ppVVar2 + i,local_3c);
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  return;
}

Assistant:

inline void RemoveAt(const int i, const int last, const uint targetBucket)
        {
            if (last < 0)
            {
                buckets[targetBucket] = entries[i].next;
            }
            else
            {
                entries[last].next = entries[i].next;
            }
            entries[i].Clear();
            weakRefs[i].Clear();
            SetNextFreeEntryIndex(entries[i], freeCount == 0 ? -1 : freeList);
            freeList = i;
            freeCount++;
        }